

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O1

int op_granpos_add(ogg_int64_t *_dst_gp,ogg_int64_t _src_gp,opus_int32 _delta)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)_src_gp;
  if (_delta < 1) {
    iVar1 = 0;
    if (_delta < 0) {
      if (-1 < _src_gp && _src_gp < (long)(ulong)(uint)-_delta) {
        return -0x83;
      }
      iVar1 = _delta;
      if (_src_gp < -0x8000000000000000 - (long)_delta) {
        _src_gp = 0x7fffffffffffffff;
        iVar1 = iVar2 + _delta + 1;
      }
    }
  }
  else {
    if ((_src_gp < 0) && (~_delta <= _src_gp)) {
      return -0x83;
    }
    iVar1 = _delta;
    if ((long)((ulong)(uint)_delta ^ 0x7fffffffffffffff) < _src_gp) {
      _src_gp = -0x8000000000000000;
      iVar1 = iVar2 + _delta;
    }
  }
  *_dst_gp = iVar1 + _src_gp;
  return 0;
}

Assistant:

static int op_granpos_add(ogg_int64_t *_dst_gp,ogg_int64_t _src_gp,
 opus_int32 _delta){
  /*The code below handles this case correctly, but there's no reason we
     should ever be called with these values, so make sure we aren't.*/
  OP_ASSERT(_src_gp!=-1);
  if(_delta>0){
    /*Adding this amount to the granule position would overflow its 64-bit
       range.*/
    if(OP_UNLIKELY(_src_gp<0)&&OP_UNLIKELY(_src_gp>=-1-_delta))return OP_EINVAL;
    if(OP_UNLIKELY(_src_gp>OP_INT64_MAX-_delta)){
      /*Adding this amount to the granule position would overflow the positive
         half of its 64-bit range.
        Since signed overflow is undefined in C, do it in a way the compiler
         isn't allowed to screw up.*/
      _delta-=(opus_int32)(OP_INT64_MAX-_src_gp)+1;
      _src_gp=OP_INT64_MIN;
    }
  }
  else if(_delta<0){
    /*Subtracting this amount from the granule position would underflow its
       64-bit range.*/
    if(_src_gp>=0&&OP_UNLIKELY(_src_gp<-_delta))return OP_EINVAL;
    if(OP_UNLIKELY(_src_gp<OP_INT64_MIN-_delta)){
      /*Subtracting this amount from the granule position would underflow the
         negative half of its 64-bit range.
        Since signed underflow is undefined in C, do it in a way the compiler
         isn't allowed to screw up.*/
      _delta+=(opus_int32)(_src_gp-OP_INT64_MIN)+1;
      _src_gp=OP_INT64_MAX;
    }
  }
  *_dst_gp=_src_gp+_delta;
  return 0;
}